

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O1

void __thiscall SqlGenerator::generateLmfaoQuery(SqlGenerator *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  Aggregate *pAVar5;
  pointer pbVar6;
  pointer ppVar7;
  char cVar8;
  bool bVar9;
  size_t sVar10;
  View *pVVar11;
  TDNode *pTVar12;
  Attribute *pAVar13;
  pointer ppAVar14;
  undefined8 *puVar15;
  long *plVar16;
  char *pcVar17;
  size_type *psVar18;
  ulong *puVar19;
  ulong uVar20;
  long *plVar21;
  undefined8 *puVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  undefined8 uVar24;
  char cVar25;
  size_t i;
  ulong uVar26;
  long lVar27;
  var_bitset *this_00;
  ulong uVar28;
  string viewAgg;
  string agg;
  string localAgg;
  string __str_1;
  string __str_2;
  string fvars;
  string aggregateString;
  string returnString;
  ofstream ofs;
  char *local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  long *local_3a0;
  long local_398;
  long local_390;
  long lStack_388;
  ulong *local_380;
  long local_378;
  ulong local_370;
  long lStack_368;
  undefined8 *local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  string local_340;
  ulong *local_320;
  uint local_318;
  undefined4 uStack_314;
  ulong local_310 [2];
  ulong local_300;
  ulong *local_2f8;
  uint local_2f0;
  undefined4 uStack_2ec;
  ulong local_2e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  View *local_278;
  ulong local_270;
  SqlGenerator *local_268;
  char *local_260;
  long local_258;
  char local_250 [16];
  size_t local_240;
  ulong local_238;
  undefined1 local_230 [8];
  uint local_228;
  _Bit_type *local_220;
  uint local_218;
  _Bit_pointer local_210;
  ios_base local_138 [264];
  
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
  uVar28 = 0;
  local_268 = this;
  do {
    sVar10 = QueryCompiler::numberOfViews
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    if (sVar10 <= uVar28) {
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_2b8);
      std::ofstream::ofstream(local_230,(string *)&local_2b8,_S_out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,local_260,local_258);
      std::ofstream::close();
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + _VTT[-3]) = _error_with_option_name;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      if (local_260 != local_250) {
        operator_delete(local_260);
      }
      return;
    }
    pVVar11 = QueryCompiler::getView
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,uVar28);
    pTVar12 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar11->_origin);
    uVar3 = pVVar11->_origin;
    uVar2 = pVVar11->_destination;
    local_240 = pTVar12->_numOfNeighbors;
    local_278 = pVVar11;
    sVar10 = QueryCompiler::numberOfViews
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    local_2b8._M_dataplus._M_p = local_2b8._M_dataplus._M_p & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_230,sVar10,(bool *)&local_2b8,
               (allocator_type *)local_298);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_300 = uVar28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
    local_240 = local_240 - (uVar3 != uVar2);
    this_00 = &local_278->_fVars;
    sVar10 = 0;
    do {
      bVar9 = std::bitset<100UL>::test(this_00,sVar10);
      if (bVar9) {
        pAVar13 = TreeDecomposition::getAttribute
                            ((local_268->_td).
                             super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,sVar10);
        local_298[0] = local_288;
        pcVar4 = (pAVar13->_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,pcVar4,pcVar4 + (pAVar13->_name)._M_string_length);
        std::__cxx11::string::append((char *)local_298);
        std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_298[0]);
        if (local_298[0] != local_288) {
          operator_delete(local_298[0]);
        }
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != 100);
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
    ppAVar14 = (local_278->_aggregates).
               super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((local_278->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppAVar14) {
      uVar28 = 0;
      do {
        pAVar5 = ppAVar14[uVar28];
        local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
        local_270 = uVar28;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0);
        if ((pAVar5->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (pAVar5->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar28 = 0;
          lVar27 = 0;
          do {
            local_3a0 = &local_390;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"");
            pbVar6 = (pAVar5->_agg).
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            sVar10 = 0;
            local_238 = uVar28;
            do {
              bVar9 = std::bitset<1500UL>::test(pbVar6 + uVar28,sVar10);
              if (bVar9) {
                getFunctionString_abi_cxx11_(&local_340,local_268,sVar10);
                puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
                local_3e0 = (char *)&local_3d0;
                pcVar17 = (char *)(puVar15 + 2);
                if ((char *)*puVar15 == pcVar17) {
                  local_3d0 = *(undefined8 *)pcVar17;
                  uStack_3c8 = puVar15[3];
                }
                else {
                  local_3d0 = *(undefined8 *)pcVar17;
                  local_3e0 = (char *)*puVar15;
                }
                local_3d8 = puVar15[1];
                *puVar15 = pcVar17;
                puVar15[1] = 0;
                *(undefined1 *)(puVar15 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_3e0);
                if (local_3e0 != (char *)&local_3d0) {
                  operator_delete(local_3e0);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != &local_340.field_2) {
                  operator_delete(local_340._M_dataplus._M_p);
                }
              }
              sVar10 = sVar10 + 1;
            } while (sVar10 != 0x5dc);
            std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_3a0);
            local_3e0 = (char *)&local_3d0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"");
            if (local_240 != 0) {
              lVar1 = local_240 + lVar27;
              do {
                ppVar7 = (pAVar5->_incoming).
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar28 = ppVar7[lVar27].first;
                cVar25 = '\x01';
                if (9 < uVar28) {
                  uVar26 = uVar28;
                  cVar8 = '\x04';
                  do {
                    cVar25 = cVar8;
                    if (uVar26 < 100) {
                      cVar25 = cVar25 + -2;
                      goto LAB_002998e1;
                    }
                    if (uVar26 < 1000) {
                      cVar25 = cVar25 + -1;
                      goto LAB_002998e1;
                    }
                    if (uVar26 < 10000) goto LAB_002998e1;
                    bVar9 = 99999 < uVar26;
                    uVar26 = uVar26 / 10000;
                    cVar8 = cVar25 + '\x04';
                  } while (bVar9);
                  cVar25 = cVar25 + '\x01';
                }
LAB_002998e1:
                uVar26 = ppVar7[lVar27].second;
                local_320 = local_310;
                std::__cxx11::string::_M_construct((ulong)&local_320,cVar25);
                std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_320,local_318,uVar28)
                ;
                plVar16 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_320,0,(char *)0x0,0x2b4b5b);
                local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
                psVar18 = (size_type *)(plVar16 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar16 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_2d8.field_2._M_allocated_capacity = *psVar18;
                  local_2d8.field_2._8_8_ = plVar16[3];
                }
                else {
                  local_2d8.field_2._M_allocated_capacity = *psVar18;
                  local_2d8._M_dataplus._M_p = (pointer)*plVar16;
                }
                local_2d8._M_string_length = plVar16[1];
                *plVar16 = (long)psVar18;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_2d8);
                local_380 = &local_370;
                puVar19 = (ulong *)(plVar16 + 2);
                if ((ulong *)*plVar16 == puVar19) {
                  local_370 = *puVar19;
                  lStack_368 = plVar16[3];
                }
                else {
                  local_370 = *puVar19;
                  local_380 = (ulong *)*plVar16;
                }
                local_378 = plVar16[1];
                *plVar16 = (long)puVar19;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                cVar25 = '\x01';
                if (9 < uVar26) {
                  uVar20 = uVar26;
                  cVar8 = '\x04';
                  do {
                    cVar25 = cVar8;
                    if (uVar20 < 100) {
                      cVar25 = cVar25 + -2;
                      goto LAB_00299a44;
                    }
                    if (uVar20 < 1000) {
                      cVar25 = cVar25 + -1;
                      goto LAB_00299a44;
                    }
                    if (uVar20 < 10000) goto LAB_00299a44;
                    bVar9 = 99999 < uVar20;
                    uVar20 = uVar20 / 10000;
                    cVar8 = cVar25 + '\x04';
                  } while (bVar9);
                  cVar25 = cVar25 + '\x01';
                }
LAB_00299a44:
                local_2f8 = local_2e8;
                std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar25);
                std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f8,local_2f0,uVar26)
                ;
                uVar26 = 0xf;
                if (local_380 != &local_370) {
                  uVar26 = local_370;
                }
                uVar20 = CONCAT44(uStack_2ec,local_2f0) + local_378;
                if (uVar26 < uVar20) {
                  uVar26 = 0xf;
                  if (local_2f8 != local_2e8) {
                    uVar26 = local_2e8[0];
                  }
                  if (uVar26 < uVar20) goto LAB_00299ad2;
                  puVar15 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_380);
                }
                else {
LAB_00299ad2:
                  puVar15 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_2f8);
                }
                local_360 = &local_350;
                puVar22 = puVar15 + 2;
                if ((undefined8 *)*puVar15 == puVar22) {
                  local_350 = *puVar22;
                  uStack_348 = puVar15[3];
                }
                else {
                  local_350 = *puVar22;
                  local_360 = (undefined8 *)*puVar15;
                }
                local_358 = puVar15[1];
                *puVar15 = puVar22;
                puVar15[1] = 0;
                *(undefined1 *)puVar22 = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_360);
                local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
                puVar19 = (ulong *)(plVar16 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar16 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar19) {
                  local_340.field_2._M_allocated_capacity = *puVar19;
                  local_340.field_2._8_8_ = plVar16[3];
                }
                else {
                  local_340.field_2._M_allocated_capacity = *puVar19;
                  local_340._M_dataplus._M_p = (pointer)*plVar16;
                }
                local_340._M_string_length = plVar16[1];
                *plVar16 = (long)puVar19;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&local_3e0,(ulong)local_340._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != &local_340.field_2) {
                  operator_delete(local_340._M_dataplus._M_p);
                }
                if (local_360 != &local_350) {
                  operator_delete(local_360);
                }
                if (local_2f8 != local_2e8) {
                  operator_delete(local_2f8);
                }
                if (local_380 != &local_370) {
                  operator_delete(local_380);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                  operator_delete(local_2d8._M_dataplus._M_p);
                }
                if (local_320 != local_310) {
                  operator_delete(local_320);
                }
                uVar26 = uVar28 + 0x3f;
                if (-1 < (long)uVar28) {
                  uVar26 = uVar28;
                }
                *(ulong *)((long)local_230 +
                          (((long)uVar26 >> 6) +
                          ((ulong)((uVar28 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) =
                     *(ulong *)((long)local_230 +
                               (((long)uVar26 >> 6) +
                               ((ulong)((uVar28 & 0x800000000000003f) < 0x8000000000000001) - 1)) *
                               8) | 1L << ((byte)uVar28 & 0x3f);
                lVar27 = lVar27 + 1;
              } while (lVar27 != lVar1);
            }
            std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_3e0);
            if (local_3c0._M_string_length != 0) {
              std::__cxx11::string::pop_back();
              std::__cxx11::string::append((char *)&local_3c0);
            }
            if (local_3e0 != (char *)&local_3d0) {
              operator_delete(local_3e0);
            }
            uVar28 = local_238;
            if (local_3a0 != &local_390) {
              operator_delete(local_3a0);
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 < (ulong)(((long)(pAVar5->_agg).
                                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pAVar5->_agg).
                                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 6) *
                                   -0x5555555555555555));
        }
        paVar23 = &local_340.field_2;
        if (local_3c0._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_3c0,0,(char *)0x0,0x2b43a5);
        }
        else {
          std::__cxx11::string::pop_back();
        }
        std::operator+(&local_2d8,"\nSUM(",&local_3c0);
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
        local_380 = &local_370;
        puVar19 = puVar15 + 2;
        if ((ulong *)*puVar15 == puVar19) {
          local_370 = *puVar19;
          lStack_368 = puVar15[3];
        }
        else {
          local_370 = *puVar19;
          local_380 = (ulong *)*puVar15;
        }
        local_378 = puVar15[1];
        *puVar15 = puVar19;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        cVar25 = '\x01';
        if (9 < local_300) {
          uVar28 = local_300;
          cVar8 = '\x04';
          do {
            cVar25 = cVar8;
            if (uVar28 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_00299e82;
            }
            if (uVar28 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_00299e82;
            }
            if (uVar28 < 10000) goto LAB_00299e82;
            bVar9 = 99999 < uVar28;
            uVar28 = uVar28 / 10000;
            cVar8 = cVar25 + '\x04';
          } while (bVar9);
          cVar25 = cVar25 + '\x01';
        }
LAB_00299e82:
        local_320 = local_310;
        std::__cxx11::string::_M_construct((ulong)&local_320,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_320,local_318,local_300);
        uVar28 = 0xf;
        if (local_380 != &local_370) {
          uVar28 = local_370;
        }
        uVar26 = CONCAT44(uStack_314,local_318) + local_378;
        if (uVar28 < uVar26) {
          uVar28 = 0xf;
          if (local_320 != local_310) {
            uVar28 = local_310[0];
          }
          if (uVar28 < uVar26) goto LAB_00299f12;
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,(ulong)local_380);
        }
        else {
LAB_00299f12:
          puVar15 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_320);
        }
        puVar22 = puVar15 + 2;
        if ((undefined8 *)*puVar15 == puVar22) {
          local_350 = *puVar22;
          uStack_348 = puVar15[3];
          local_360 = &local_350;
        }
        else {
          local_350 = *puVar22;
          local_360 = (undefined8 *)*puVar15;
        }
        local_358 = puVar15[1];
        *puVar15 = puVar22;
        puVar15[1] = 0;
        *(undefined1 *)puVar22 = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
        puVar19 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar19) {
          local_340.field_2._M_allocated_capacity = *puVar19;
          local_340.field_2._8_8_ = puVar15[3];
          local_340._M_dataplus._M_p = (pointer)paVar23;
        }
        else {
          local_340.field_2._M_allocated_capacity = *puVar19;
          local_340._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_340._M_string_length = puVar15[1];
        *puVar15 = puVar19;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        cVar25 = '\x01';
        if (9 < local_270) {
          uVar28 = local_270;
          cVar8 = '\x04';
          do {
            cVar25 = cVar8;
            if (uVar28 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0029a04b;
            }
            if (uVar28 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0029a04b;
            }
            if (uVar28 < 10000) goto LAB_0029a04b;
            bVar9 = 99999 < uVar28;
            uVar28 = uVar28 / 10000;
            cVar8 = cVar25 + '\x04';
          } while (bVar9);
          cVar25 = cVar25 + '\x01';
        }
LAB_0029a04b:
        local_2f8 = local_2e8;
        std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f8,local_2f0,local_270);
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar23) {
          uVar24 = local_340.field_2._M_allocated_capacity;
        }
        uVar28 = CONCAT44(uStack_2ec,local_2f0) + local_340._M_string_length;
        if ((ulong)uVar24 < uVar28) {
          uVar26 = 0xf;
          if (local_2f8 != local_2e8) {
            uVar26 = local_2e8[0];
          }
          if (uVar26 < uVar28) goto LAB_0029a0df;
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
        }
        else {
LAB_0029a0df:
          puVar15 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_2f8);
        }
        local_3e0 = (char *)&local_3d0;
        pcVar17 = (char *)(puVar15 + 2);
        if ((char *)*puVar15 == pcVar17) {
          local_3d0 = *(undefined8 *)pcVar17;
          uStack_3c8 = puVar15[3];
        }
        else {
          local_3d0 = *(undefined8 *)pcVar17;
          local_3e0 = (char *)*puVar15;
        }
        local_3d8 = puVar15[1];
        *puVar15 = pcVar17;
        puVar15[1] = 0;
        *pcVar17 = '\0';
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_3e0);
        local_3a0 = &local_390;
        plVar21 = plVar16 + 2;
        if ((long *)*plVar16 == plVar21) {
          local_390 = *plVar21;
          lStack_388 = plVar16[3];
        }
        else {
          local_390 = *plVar21;
          local_3a0 = (long *)*plVar16;
        }
        local_398 = plVar16[1];
        *plVar16 = (long)plVar21;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_298,(ulong)local_3a0);
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_3e0 != (char *)&local_3d0) {
          operator_delete(local_3e0);
        }
        if (local_2f8 != local_2e8) {
          operator_delete(local_2f8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar23) {
          operator_delete(local_340._M_dataplus._M_p);
        }
        if (local_360 != &local_350) {
          operator_delete(local_360);
        }
        if (local_320 != local_310) {
          operator_delete(local_320);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
          operator_delete(local_3c0._M_dataplus._M_p);
        }
        uVar28 = local_270 + 1;
        ppAVar14 = (local_278->_aggregates).
                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (uVar28 < (ulong)((long)(local_278->_aggregates).
                                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar14 >>
                               3));
    }
    std::__cxx11::string::pop_back();
    cVar25 = '\x01';
    if (9 < local_300) {
      uVar28 = local_300;
      cVar8 = '\x04';
      do {
        cVar25 = cVar8;
        if (uVar28 < 100) {
          cVar25 = cVar25 + -2;
          goto LAB_0029a314;
        }
        if (uVar28 < 1000) {
          cVar25 = cVar25 + -1;
          goto LAB_0029a314;
        }
        if (uVar28 < 10000) goto LAB_0029a314;
        bVar9 = 99999 < uVar28;
        uVar28 = uVar28 / 10000;
        cVar8 = cVar25 + '\x04';
      } while (bVar9);
      cVar25 = cVar25 + '\x01';
    }
LAB_0029a314:
    local_320 = local_310;
    std::__cxx11::string::_M_construct((ulong)&local_320,cVar25);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_320,local_318,local_300);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,0x2b4a6c);
    pVVar11 = local_278;
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    psVar18 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_2d8.field_2._M_allocated_capacity = *psVar18;
      local_2d8.field_2._8_8_ = puVar15[3];
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *psVar18;
      local_2d8._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_2d8._M_string_length = puVar15[1];
    *puVar15 = psVar18;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
    local_380 = &local_370;
    puVar19 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar19) {
      local_370 = *puVar19;
      lStack_368 = puVar15[3];
    }
    else {
      local_370 = *puVar19;
      local_380 = (ulong *)*puVar15;
    }
    local_378 = puVar15[1];
    *puVar15 = puVar19;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_2b8._M_dataplus._M_p);
    puVar22 = puVar15 + 2;
    if ((undefined8 *)*puVar15 == puVar22) {
      local_350 = *puVar22;
      uStack_348 = puVar15[3];
      local_360 = &local_350;
    }
    else {
      local_350 = *puVar22;
      local_360 = (undefined8 *)*puVar15;
    }
    local_358 = puVar15[1];
    *puVar15 = puVar22;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_298[0]);
    puVar19 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar19) {
      local_340.field_2._M_allocated_capacity = *puVar19;
      local_340.field_2._8_8_ = puVar15[3];
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    }
    else {
      local_340.field_2._M_allocated_capacity = *puVar19;
      local_340._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_340._M_string_length = puVar15[1];
    *puVar15 = puVar19;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
    local_3e0 = (char *)&local_3d0;
    pcVar17 = (char *)(puVar15 + 2);
    if ((char *)*puVar15 == pcVar17) {
      local_3d0 = *(undefined8 *)pcVar17;
      uStack_3c8 = puVar15[3];
    }
    else {
      local_3d0 = *(undefined8 *)pcVar17;
      local_3e0 = (char *)*puVar15;
    }
    local_3d8 = puVar15[1];
    *puVar15 = pcVar17;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    pTVar12 = TreeDecomposition::getRelation
                        ((local_268->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar11->_origin);
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_3e0,(ulong)(pTVar12->_name)._M_dataplus._M_p);
    local_3a0 = &local_390;
    plVar16 = puVar15 + 2;
    if ((long *)*puVar15 == plVar16) {
      local_390 = *plVar16;
      lStack_388 = puVar15[3];
    }
    else {
      local_390 = *plVar16;
      local_3a0 = (long *)*puVar15;
    }
    local_398 = puVar15[1];
    *puVar15 = plVar16;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_3a0);
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    psVar18 = (size_type *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_3c0.field_2._M_allocated_capacity = *psVar18;
      local_3c0.field_2._8_8_ = plVar16[3];
    }
    else {
      local_3c0.field_2._M_allocated_capacity = *psVar18;
      local_3c0._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_3c0._M_string_length = plVar16[1];
    *plVar16 = (long)psVar18;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_3c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0);
    }
    if (local_3e0 != (char *)&local_3d0) {
      operator_delete(local_3e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    this = local_268;
    if (local_360 != &local_350) {
      operator_delete(local_360);
    }
    if (local_380 != &local_370) {
      operator_delete(local_380);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
    if (local_320 != local_310) {
      operator_delete(local_320);
    }
    for (uVar26 = 0;
        sVar10 = QueryCompiler::numberOfViews
                           ((this->_qc).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
        uVar28 = local_300, uVar26 < sVar10; uVar26 = uVar26 + 1) {
      uVar28 = uVar26 + 0x3f;
      if (-1 < (long)uVar26) {
        uVar28 = uVar26;
      }
      if ((*(ulong *)((long)local_230 +
                     (((long)uVar28 >> 6) +
                     ((ulong)((uVar26 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) >>
           (uVar26 & 0x3f) & 1) != 0) {
        cVar25 = '\x01';
        if (9 < uVar26) {
          uVar28 = uVar26;
          cVar8 = '\x04';
          do {
            cVar25 = cVar8;
            if (uVar28 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0029a78b;
            }
            if (uVar28 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0029a78b;
            }
            if (uVar28 < 10000) goto LAB_0029a78b;
            bVar9 = 99999 < uVar28;
            uVar28 = uVar28 / 10000;
            cVar8 = cVar25 + '\x04';
          } while (bVar9);
          cVar25 = cVar25 + '\x01';
        }
LAB_0029a78b:
        local_3e0 = (char *)&local_3d0;
        std::__cxx11::string::_M_construct((ulong)&local_3e0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_3e0,(uint)local_3d8,uVar26);
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_3e0,0,(char *)0x0,0x2b4a92);
        local_3a0 = &local_390;
        plVar16 = puVar15 + 2;
        if ((long *)*puVar15 == plVar16) {
          local_390 = *plVar16;
          lStack_388 = puVar15[3];
        }
        else {
          local_390 = *plVar16;
          local_3a0 = (long *)*puVar15;
        }
        local_398 = puVar15[1];
        *puVar15 = plVar16;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
        local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
        psVar18 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_3c0.field_2._M_allocated_capacity = *psVar18;
          local_3c0.field_2._8_8_ = puVar15[3];
        }
        else {
          local_3c0.field_2._M_allocated_capacity = *psVar18;
          local_3c0._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_3c0._M_string_length = puVar15[1];
        *puVar15 = psVar18;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_3c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
          operator_delete(local_3c0._M_dataplus._M_p);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_3e0 != (char *)&local_3d0) {
          operator_delete(local_3e0);
        }
      }
    }
    if (local_2b8._M_string_length != 0) {
      std::__cxx11::string::pop_back();
      std::operator+(&local_3c0,"\nGROUP BY ",&local_2b8);
      std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_3c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p);
      }
    }
    std::__cxx11::string::append((char *)&local_260);
    if (local_298[0] != local_288) {
      operator_delete(local_298[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
    if (local_230 != (undefined1  [8])0x0) {
      operator_delete((void *)local_230);
      local_230 = (undefined1  [8])0x0;
      local_228 = 0;
      local_220 = (_Bit_type *)0x0;
      local_218 = 0;
      local_210 = (_Bit_pointer)0x0;
    }
    uVar28 = uVar28 + 1;
  } while( true );
}

Assistant:

void SqlGenerator::generateLmfaoQuery()
{
    string returnString = "";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* v = _qc->getView(viewID);
        TDNode* node = _td->getRelation(v->_origin);

        size_t numberIncomingViews =
            (v->_origin == v->_destination ? node->_numOfNeighbors :
             node->_numOfNeighbors - 1);
        
        vector<bool> viewBitset(_qc->numberOfViews());

        string fvars = ""; 
        for (size_t i = 0; i < NUM_OF_VARIABLES; ++i)
            if (v->_fVars.test(i))
                fvars +=  _td->getAttribute(i)->_name + ",";
       
        string aggregateString = "";
        for (size_t aggNo = 0; aggNo < v->_aggregates.size(); ++aggNo)
        {
            Aggregate* aggregate = v->_aggregates[aggNo];

            string agg = "";
            size_t incomingCounter = 0;
            for (size_t i = 0; i < aggregate->_agg.size(); ++i)
            {
                string localAgg = "";
                const prod_bitset& product = aggregate->_agg[i];
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                {  
                    if (product.test(f))
                        localAgg += getFunctionString(f)+"*";
                }

                agg += localAgg;
                
                string viewAgg = "";
                for (size_t n = 0; n < numberIncomingViews; ++n)
                {
                    std::pair<size_t,size_t> viewAggID =
                        aggregate->_incoming[incomingCounter];
                    
                    viewAgg += "agg_"+to_string(viewAggID.first)+"_"+
                        to_string(viewAggID.second)+"*";
                    viewBitset[viewAggID.first] = 1;
                    ++incomingCounter;
                }

                agg += viewAgg;

                if (!agg.empty())
                {
                    agg.pop_back();
                    agg += "+";
                }              
            }

            if (agg.empty())
                agg = "1";
            else
                agg.pop_back();

            aggregateString += "\nSUM("+agg+") AS agg_"+to_string(viewID)+
                "_"+to_string(aggNo)+",";
        }

        aggregateString.pop_back();

        
        returnString += "CREATE TABLE view_"+to_string(viewID)+" AS\nSELECT "+fvars+
            aggregateString+"\nFROM "+_td->getRelation(v->_origin)->_name+" ";
        for (size_t id = 0; id < _qc->numberOfViews(); ++id)
            if (viewBitset[id])
                returnString += "NATURAL JOIN view_"+to_string(id)+" ";

        if (!fvars.empty())
        {
            fvars.pop_back();
            returnString += "\nGROUP BY "+fvars;
        }
        
        returnString += ";\n\n";
    }

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/lmfao.sql", std::ofstream::out);
    ofs << returnString;
    ofs.close();
    // DINFO(returnString);   
}